

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O3

int func_extract(int ip)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  byte bVar7;
  
  ppuVar3 = __ctype_b_loc();
  iVar4 = ip + -1;
  pcVar5 = prlnbuf + ip;
  do {
    cVar1 = *pcVar5;
    iVar4 = iVar4 + 1;
    pcVar5 = pcVar5 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  pcVar5 = func_line;
  iVar2 = 0;
  iVar6 = 0;
  do {
    bVar7 = prlnbuf[iVar4];
    if (bVar7 == 0x5c) {
      *pcVar5 = 0x5c;
      bVar7 = prlnbuf[(long)iVar4 + 1];
      if ((byte)(bVar7 - 0x3a) < 0xf7) {
        pcVar5 = "Invalid function argument!";
        goto LAB_0010c7b5;
      }
      iVar4 = iVar4 + 2;
      iVar6 = iVar6 + 1;
      pcVar5 = (char *)((byte *)pcVar5 + 1);
      if (iVar2 <= (int)(bVar7 - 0x31)) {
        iVar2 = bVar7 - 0x31;
      }
    }
    else if ((bVar7 == 0) || (iVar4 = iVar4 + 1, bVar7 == 0x3b)) {
      *pcVar5 = 0;
      return iVar2;
    }
    *pcVar5 = bVar7;
    iVar6 = iVar6 + 1;
    pcVar5 = (char *)((byte *)pcVar5 + 1);
  } while (iVar6 != 0x7f);
  pcVar5 = "Function line too long!";
LAB_0010c7b5:
  error(pcVar5);
  return -1;
}

Assistant:

int
func_extract(int ip)
{
	char *ptr;
	char  c;
	int   i, arg, max_arg;
	int   end;

	/* skip spaces */
	while (isspace(prlnbuf[ip]))
		ip++;

	/* get function body */
	ptr = func_line;
	max_arg = 0;
	end = 0;
	i = 0;

	while (!end) {
		c = prlnbuf[ip++];
		switch (c) {
		/* end of line */	
		case ';':
		case '\0':
		   *ptr++ = '\0';
			end = 1;
			break;

		/* function arg */
		case '\\':
		   *ptr++ = c;
		    i++;
			c = prlnbuf[ip++];
			if ((c < '1') || (c > '9')) {
				error("Invalid function argument!");
				return (-1);
			}
			arg = c - '1';
			if (max_arg < arg)
				max_arg = arg;

		/* other */
		default:
		   *ptr++ = c;
		    i++;
			if (i == 127) {
				error("Function line too long!");
				return (-1);
			}
			break;
		}
	}

	/* return the number of args */
	return (max_arg);
}